

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O0

char_class_type __thiscall
boost::xpressive::cpp_regex_traits<char>::lookup_classname<char_const*>
          (cpp_regex_traits<char> *this,char *begin,char *end,bool icase)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_00;
  ulong uVar1;
  byte in_CL;
  size_type len;
  size_type i;
  string_type classname;
  char_class_type char_class;
  char_type in_stack_ffffffffffffff3f;
  cpp_regex_traits<char> *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4e;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  char_type in_stack_ffffffffffffff5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  ulong local_60;
  allocator<char> local_41;
  string local_40 [36];
  char_class_type local_1c;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1c = lookup_classname_impl_<char_const*>
                       ((char *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48),
                        (char *)in_stack_ffffffffffffff40);
  if (local_1c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (in_stack_ffffffffffffff60,
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50._M_current,
               (allocator<char> *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48));
    std::allocator<char>::~allocator(&local_41);
    local_60 = 0;
    uVar1 = std::__cxx11::string::size();
    for (; local_60 < uVar1; local_60 = local_60 + 1) {
      std::__cxx11::string::operator[]((ulong)local_40);
      in_stack_ffffffffffffff5f =
           translate_nocase(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
      in_stack_ffffffffffffff50._M_current =
           (char *)std::__cxx11::string::operator[]((ulong)local_40);
      *in_stack_ffffffffffffff50._M_current = in_stack_ffffffffffffff5f;
    }
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    begin_00._M_current._7_1_ = in_stack_ffffffffffffff5f;
    begin_00._M_current._0_7_ = in_stack_ffffffffffffff58;
    local_1c = lookup_classname_impl_<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (begin_00,in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(local_40);
  }
  if (((local_19 & 1) != 0) && ((local_1c & 0x300) != 0)) {
    local_1c = local_1c | 0x300;
  }
  return local_1c;
}

Assistant:

char_class_type lookup_classname(FwdIter begin, FwdIter end, bool icase) const
    {
        static detail::umaskex_t const icase_masks =
            detail::std_ctype_lower | detail::std_ctype_upper;

        BOOST_ASSERT(begin != end);
        char_class_type char_class = this->lookup_classname_impl_(begin, end);
        if(0 == char_class)
        {
            // convert the string to lowercase
            string_type classname(begin, end);
            for(typename string_type::size_type i = 0, len = classname.size(); i < len; ++i)
            {
                classname[i] = this->translate_nocase(classname[i]);
            }
            char_class = this->lookup_classname_impl_(classname.begin(), classname.end());
        }
        // erase case-sensitivity if icase==true
        if(icase && 0 != (char_class & icase_masks))
        {
            char_class |= icase_masks;
        }
        return char_class;
    }